

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

string * __thiscall
Database::Last_abi_cxx11_(string *__return_storage_ptr__,Database *this,Date *date)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  const_reference pvVar4;
  bool local_1f1;
  bool local_1c9;
  ostringstream local_1c8 [8];
  ostringstream fmt;
  _Self local_50;
  _Self local_48;
  const_iterator it;
  allocator<char> local_29;
  _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  Date *local_20;
  Date *date_local;
  Database *this_local;
  
  local_20 = date;
  date_local = (Date *)this;
  this_local = (Database *)__return_storage_ptr__;
  bVar1 = std::
          map<Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::empty(&this->storage);
  local_1c9 = true;
  if (!bVar1) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::begin(&this->storage);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_28);
    local_1c9 = Date::operator>(&ppVar2->first,local_20);
  }
  if (local_1c9 == false) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::lower_bound(&this->storage,local_20);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(&this->storage);
    bVar1 = std::operator==(&local_48,&local_50);
    local_1f1 = true;
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_48);
      local_1f1 = Date::operator>(&ppVar2->first,local_20);
    }
    if (local_1f1 != false) {
      std::
      _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator--(&local_48);
    }
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_48);
    poVar3 = operator<<((ostream *)local_1c8,&ppVar2->first);
    poVar3 = std::operator<<(poVar3,' ');
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_48);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&ppVar2->second);
    std::operator<<(poVar3,(string *)pvVar4);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"No entries",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

string Database::Last(const Date& date) const {
    if (storage.empty() || storage.begin()->first > date) {
        return "No entries";
    }

    auto it = storage.lower_bound(date);
    if (it == storage.end() || it->first > date) {
        --it;
    }

    ostringstream fmt;
    fmt << it->first << ' ' << it->second.back();

    return fmt.str();
}